

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-formulas.c
# Opt level: O2

math_section * parse_condition(char *line,char *full_line)

{
  char *pcVar1;
  size_t sVar2;
  math_section *pmVar3;
  
  pcVar1 = strchr(line,0x28);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    sVar2 = strlen(pcVar1 + 1);
    if (pcVar1[sVar2] == ')') {
      pcVar1[sVar2] = '\0';
      pmVar3 = parse_formula_section(pcVar1 + 1,full_line);
      return pmVar3;
    }
    pcVar1 = "** no ending \')\'";
  }
  borg_formula_error(line,full_line,"condition",pcVar1);
  return (math_section *)0x0;
}

Assistant:

static struct math_section *parse_condition(char *line, const char *full_line)
{
    char *start = line;
    line        = strchr(line, '(');
    if (!line) {
        borg_formula_error(start, full_line, "condition", NULL);
        return NULL;
    }

    /* skip the "(" */
    line++;

    /* remove the end ) */
    if (line[strlen(line) - 1] != ')') {
        borg_formula_error(start, full_line, "condition", "** no ending ')'");
        return NULL;
    }
    line[strlen(line) - 1] = 0;

    return parse_formula_section(line, full_line);
}